

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void pd_floatforsignal(t_pd *x,t_float f)

{
  int offset;
  t_float f_local;
  t_pd *x_local;
  
  if ((*x)->c_floatsignalin < 1) {
    pd_error(x,"%s: float unexpected for signal input",(*x)->c_name->s_name);
  }
  else {
    *(t_float *)((long)x + (long)(*x)->c_floatsignalin) = f;
  }
  return;
}

Assistant:

static void pd_floatforsignal(t_pd *x, t_float f)
{
    int offset = (*x)->c_floatsignalin;
    if (offset > 0)
        *(t_float *)(((char *)x) + offset) = f;
    else
        pd_error(x, "%s: float unexpected for signal input",
            (*x)->c_name->s_name);
}